

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateClearingCode
          (SingularStringView *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  LogMessage *pLVar3;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  byte local_89;
  LogMessage local_88;
  Voidify local_73 [3];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularStringView *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::is_oneof(&this->super_FieldGeneratorBase);
  if (bVar2) {
    bVar2 = use_micro_string(this);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_28,"\n        if (GetArena() == nullptr) $field_$.Destroy();\n      ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"\n      $field_$.Destroy();\n    ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_40._M_len,local_40._M_str);
    }
  }
  else {
    bVar2 = EmptyDefault(this);
    if (bVar2) {
      bVar2 = use_micro_string(this);
      pPVar1 = local_18;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_58,"\n        $field_$.Clear();\n      ");
        protobuf::io::Printer::SourceLocation::current();
        protobuf::io::Printer::Emit(pPVar1,local_58._M_len,local_58._M_str);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_70,"\n      $field_$.ClearToEmpty();\n    ");
        protobuf::io::Printer::SourceLocation::current();
        protobuf::io::Printer::Emit(pPVar1,local_70._M_len,local_70._M_str);
      }
    }
    else {
      bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
      local_89 = 0;
      if (bVar2) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_generators/string_view_field.cc"
                   ,0x187,"!is_inlined()");
        local_89 = 1;
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_73,pLVar3);
      }
      pPVar1 = local_18;
      if ((local_89 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_88);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_a0,"\n    $field_$.ClearToDefault($lazy_var$, GetArena());\n  ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_a0._M_len,local_a0._M_str);
    }
  }
  return;
}

Assistant:

void SingularStringView::GenerateClearingCode(io::Printer* p) const {
  if (is_oneof()) {
    if (use_micro_string()) {
      p->Emit(R"cc(
        if (GetArena() == nullptr) $field_$.Destroy();
      )cc");
      return;
    }
    p->Emit(R"cc(
      $field_$.Destroy();
    )cc");
    return;
  }

  if (EmptyDefault()) {
    if (use_micro_string()) {
      p->Emit(R"cc(
        $field_$.Clear();
      )cc");
      return;
    }
    p->Emit(R"cc(
      $field_$.ClearToEmpty();
    )cc");
    return;
  }

  ABSL_DCHECK(!is_inlined());
  p->Emit(R"cc(
    $field_$.ClearToDefault($lazy_var$, GetArena());
  )cc");
}